

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O1

void process_task(void *p)

{
  list_head *plVar1;
  list_head *plVar2;
  RK_U32 *pRVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  RK_U32 RVar7;
  pthread_mutex_t *__mutex;
  list_head *plVar8;
  list_head *plVar9;
  list_head *plVar10;
  list_head *plVar11;
  list_head *plVar12;
  MppCbCtx *ctx;
  list_head *plVar13;
  long lVar14;
  long *plVar15;
  MppDevBatCmd *pMVar16;
  MppReqV1 *pMVar17;
  long lVar18;
  MppReqV1 *pMVar19;
  RK_U32 RVar20;
  RK_U32 RVar21;
  MppDevBatTask *batch;
  uint uVar22;
  int *piVar23;
  long lVar24;
  long lVar25;
  char *fmt;
  long *plVar26;
  list_head *plVar27;
  list_head *head___1;
  list_head *head__;
  list_head *head___3;
  char *in_stack_ffffffffffffff90;
  
  __mutex = *p;
  if (((byte)mpp_server_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_server","process task start\n",(char *)0x0);
  }
  plVar1 = (list_head *)((long)p + 0x38);
  plVar2 = (list_head *)((long)p + 0x48);
  do {
    plVar8 = plVar1->next;
    if (plVar8 == plVar1) break;
    if ((*(int *)((long)&plVar8[4].next + 4) == 0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch->wait_req_cnt"
                   ,"process_task",0x103), (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0011f06f;
    uVar22 = mpp_service_ioctl_request(*(RK_S32 *)((long)p + 8),(MppReqV1 *)plVar8[3].prev);
    if (uVar22 != 0) {
      uVar6 = *(uint *)&plVar8[2].next;
      piVar23 = __errno_location();
      iVar4 = *piVar23;
      in_stack_ffffffffffffff90 = strerror(iVar4);
      _mpp_log_l(4,"mpp_server","batch %d poll ret %d errno %d %s","process_task",(ulong)uVar6,
                 (ulong)uVar22,iVar4,in_stack_ffffffffffffff90);
      _mpp_log_l(4,"mpp_server","stop timer\n","process_task");
      mpp_timer_set_enable(*(MppTimer *)((long)p + 0x18),0);
      break;
    }
    plVar9 = plVar8[1].next;
joined_r0x0011e7c7:
    plVar13 = plVar9;
    if (plVar13 != plVar8 + 1) {
      plVar9 = plVar13->next;
      plVar27 = plVar8[2].prev + *(int *)&plVar13[2].prev;
      if ((*(int *)&plVar13[2].prev < *(int *)((long)p + 0x70)) ||
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "batch_slot_id < server->max_task_in_batch","process_task",0x10c),
         (mpp_debug._3_1_ & 0x10) == 0)) {
        iVar4 = *(int *)((long)&plVar27->prev + 4);
        if (iVar4 != 0) goto code_r0x0011e82f;
        plVar10 = plVar13[1].next;
        plVar11 = plVar13->next;
        plVar12 = plVar13->prev;
        plVar11->prev = plVar12;
        plVar12->next = plVar11;
        plVar13->next = plVar13;
        plVar13->prev = plVar13;
        plVar13[1].prev = (list_head *)0x0;
        if (((byte)mpp_server_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_server","batch %d:%d session %d ready and remove\n",(char *)0x0,
                     (ulong)*(uint *)&plVar8[2].next,(ulong)*(uint *)&plVar13[2].prev,
                     *(undefined4 *)&plVar10[4].prev);
        }
        pthread_mutex_lock((pthread_mutex_t *)plVar10->next);
        *(int *)&plVar10[5].next = *(int *)&plVar10[5].next + 1;
        pthread_cond_signal((pthread_cond_t *)&plVar10->next[2].prev);
        pthread_mutex_unlock((pthread_mutex_t *)plVar10->next);
        if ((plVar10[3].prev != (list_head *)0x0) &&
           (ctx = (MppCbCtx *)plVar10[3].prev[2].next, ctx != (MppCbCtx *)0x0)) {
          mpp_callback_f("process_task",ctx,(void *)0x0);
        }
        piVar23 = (int *)((long)&plVar8[5].next + 4);
        *piVar23 = *piVar23 + 1;
        goto LAB_0011e90f;
      }
      goto LAB_0011f06f;
    }
    if (((byte)mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","batch %d fill %d poll %d\n",(char *)0x0,
                 (ulong)*(uint *)&plVar8[2].next,(ulong)*(uint *)&plVar8[4].prev,
                 *(undefined4 *)((long)&plVar8[5].next + 4));
    }
    iVar4 = *(int *)&plVar8[4].prev;
    iVar5 = *(int *)((long)&plVar8[5].next + 4);
    if (iVar5 != iVar4) break;
    if (((byte)mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","batch %d poll done\n",(char *)0x0,(ulong)*(uint *)&plVar8[2].next);
    }
    plVar9 = plVar8->next;
    plVar13 = plVar8->prev;
    plVar9->prev = plVar13;
    plVar13->next = plVar9;
    plVar8->next = plVar8;
    plVar8->prev = plVar8;
    plVar9 = *(list_head **)((long)p + 0x50);
    *(list_head **)((long)p + 0x50) = plVar8;
    plVar8->next = plVar2;
    plVar8->prev = plVar9;
    plVar9->next = plVar8;
    *(int *)((long)p + 0x68) = *(int *)((long)p + 0x68) + -1;
    *(int *)((long)p + 0x6c) = *(int *)((long)p + 0x6c) + 1;
    batch_reset((MppDevBatTask *)&plVar8[-1].prev);
  } while (iVar5 == iVar4);
  pthread_mutex_lock(__mutex);
  uVar22 = *(uint *)((long)p + 0x88);
  if ((((uVar22 == 0) && (*(int *)((long)p + 0x68) == 0)) && (*(int *)((long)p + 0x30) == 0)) &&
     (mpp_timer_set_enable(*(MppTimer *)((long)p + 0x18),0), ((byte)mpp_server_debug & 1) != 0)) {
    _mpp_log_l(4,"mpp_server","stop timer\n",(char *)0x0);
  }
  pthread_mutex_unlock(__mutex);
  if (((byte)mpp_server_debug & 1) != 0) {
    in_stack_ffffffffffffff90 =
         (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          *(undefined4 *)((long)p + 0x60));
    _mpp_log_l(4,"mpp_server","pending %d running %d free %d max %d process start\n",(char *)0x0,
               (ulong)uVar22,(ulong)*(uint *)((long)p + 0x68),*(undefined4 *)((long)p + 0x6c),
               in_stack_ffffffffffffff90);
  }
  while( true ) {
    if (*(int *)((long)p + 0x6c) == 0) {
      if (*(int *)((long)p + 0x60) <= *(int *)((long)p + 0x68)) {
        if (((byte)mpp_server_debug & 1) == 0) {
          return;
        }
        fmt = "finish for not batch slot\n";
        goto LAB_0011f053;
      }
      batch_add((MppDevBatServ *)p);
    }
    if ((*(int *)((long)p + 0x6c) == 0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"server->batch_free",
                   "process_task",0x159), (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0011f06f;
    if (uVar22 == 0) break;
    if (((byte)mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","pending task %d left to process\n",(char *)0x0,(ulong)uVar22);
    }
    if (*(int *)((long)p + 0x6c) == 0) {
      return;
    }
    batch = (MppDevBatTask *)&plVar2->next[-1].prev;
    if ((plVar2->next == plVar2) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch",
                   "process_task",0x17a), batch = (MppDevBatTask *)0x0,
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0011f06f;
    pthread_mutex_lock(__mutex);
    plVar26 = (long *)0x0;
    if (*(long **)((long)p + 0x78) != (long *)((long)p + 0x78)) {
      plVar26 = *(long **)((long)p + 0x78);
    }
    lVar14 = *plVar26;
    plVar15 = (long *)plVar26[1];
    *(long **)(lVar14 + 8) = plVar15;
    *plVar15 = lVar14;
    *plVar26 = (long)plVar26;
    plVar26[1] = (long)plVar26;
    *(int *)((long)p + 0x88) = *(int *)((long)p + 0x88) + -1;
    pthread_mutex_unlock(__mutex);
    iVar4 = batch->fill_cnt;
    if (iVar4 == 0) {
      RVar7 = *(RK_U32 *)((long)p + 0xc);
      *(RK_U32 *)((long)p + 0xc) = RVar7 + 1;
      batch->batch_id = RVar7;
    }
    plVar26[7] = (long)batch;
    batch->fill_cnt = iVar4 + 1;
    *(int *)(plVar26 + 9) = iVar4;
    if ((*(int *)((long)p + 0x70) <= iVar4) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "task->batch_slot_id < server->max_task_in_batch","process_task",0x18b),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0011f06f;
    plVar8 = (batch->link_tasks).prev;
    (batch->link_tasks).prev = (list_head *)(plVar26 + 4);
    plVar26[4] = (long)&batch->link_tasks;
    plVar26[5] = (long)plVar8;
    plVar8->next = (list_head *)(plVar26 + 4);
    if (*(int *)((long)p + 0x70) <= batch->fill_cnt) {
      batch->fill_full = 1;
    }
    lVar14 = plVar26[6];
    if (((lVar14 == 0) &&
        (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session",
                    "process_task",0x191), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((*(long *)(lVar14 + 0x38) == 0 &&
        (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session->ctx",
                    "process_task",0x192), (mpp_debug._3_1_ & 0x10) != 0)))) goto LAB_0011f06f;
    pMVar16 = batch->bat_cmd;
    iVar4 = (int)plVar26[9];
    pMVar16[iVar4].flag = 0;
    pMVar16[iVar4].client = *(RK_S32 *)(lVar14 + 0x48);
    pMVar16[iVar4].ret = 0;
    pMVar17 = batch->send_reqs;
    iVar5 = batch->send_req_cnt;
    batch->send_req_cnt = iVar5 + 1;
    pMVar19 = pMVar17 + iVar5;
    pMVar19->cmd = 0x204;
    pMVar19->flag = 1;
    pMVar19->size = 0x10;
    pMVar19->offset = 0;
    pMVar17[iVar5].data_ptr = (RK_U64)(pMVar16 + iVar4);
    if (0 < (int)plVar26[0xb]) {
      lVar24 = 0;
      lVar25 = 0;
      do {
        lVar18 = plVar26[10];
        pMVar19 = batch->send_reqs;
        iVar5 = batch->send_req_cnt;
        batch->send_req_cnt = iVar5 + 1;
        pMVar19[iVar5].data_ptr = *(RK_U64 *)(lVar18 + 0x10 + lVar24);
        pRVar3 = (RK_U32 *)(lVar18 + lVar24);
        RVar7 = pRVar3[1];
        RVar20 = pRVar3[2];
        RVar21 = pRVar3[3];
        pMVar19 = pMVar19 + iVar5;
        pMVar19->cmd = *pRVar3;
        pMVar19->flag = RVar7;
        pMVar19->size = RVar20;
        pMVar19->offset = RVar21;
        lVar25 = lVar25 + 1;
        lVar24 = lVar24 + 0x18;
      } while (lVar25 < (int)plVar26[0xb]);
    }
    if ((*(int *)((long)p + 0x70) * 0x10 < batch->send_req_cnt) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "batch->send_req_cnt <= server->max_task_in_batch * 16","process_task",0x1a9),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0011f06f;
    pMVar17 = batch->wait_reqs;
    iVar5 = batch->wait_req_cnt;
    batch->wait_req_cnt = iVar5 + 1;
    pMVar19 = pMVar17 + iVar5;
    pMVar19->cmd = 0x204;
    pMVar19->flag = 1;
    pMVar19->size = 0x10;
    pMVar19->offset = 0;
    pMVar17[iVar5].data_ptr = (RK_U64)(pMVar16 + iVar4);
    batch->wait_req_cnt = iVar5 + 2;
    pMVar17[(long)iVar5 + 1].cmd = 0x300;
    pMVar17[(long)iVar5 + 1].flag = 0x23;
    pMVar17 = pMVar17 + (long)iVar5 + 1;
    pMVar17->size = 0;
    pMVar17->offset = 0;
    *(RK_U64 *)(&pMVar17->size + 2) = 0;
    if (((byte)mpp_server_debug & 1) != 0) {
      in_stack_ffffffffffffff90 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)plVar26[8]);
      _mpp_log_l(4,"mpp_server","batch %d:%d add task %d:%d:%d\n",(char *)0x0,(ulong)batch->batch_id
                 ,(ulong)*(uint *)(plVar26 + 9),*(undefined4 *)(lVar14 + 0x48),
                 in_stack_ffffffffffffff90,*(undefined4 *)((long)plVar26 + 0x44));
    }
    uVar22 = uVar22 - 1;
    if (batch->fill_full != 0) {
      plVar8 = &batch->link_server;
      plVar9 = (batch->link_server).next;
      plVar13 = (batch->link_server).prev;
      plVar9->prev = plVar13;
      plVar13->next = plVar9;
      (batch->link_server).next = plVar8;
      (batch->link_server).prev = plVar8;
      plVar9 = *(list_head **)((long)p + 0x40);
      *(list_head **)((long)p + 0x40) = plVar8;
      (batch->link_server).next = plVar1;
      (batch->link_server).prev = plVar9;
      plVar9->next = plVar8;
      if (((byte)mpp_server_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_server","batch %d -> fill_nb %d fill ready\n",(char *)0x0,
                   (ulong)batch->batch_id,(ulong)(uint)batch->fill_cnt);
      }
      batch_send((MppDevBatServ *)p,batch);
    }
  }
  if (*(int *)((long)p + 0x6c) != 0) {
    plVar1 = *(list_head **)((long)p + 0x48);
    if (plVar1 == plVar2) {
      _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"batch","process_task",
                 0x163);
      if ((mpp_debug._3_1_ & 0x10) == 0) {
        _mpp_log_l(4,"mpp_server","batch run %d free %d\n","process_task",
                   (ulong)*(uint *)((long)p + 0x68),(ulong)*(uint *)((long)p + 0x6c));
        return;
      }
LAB_0011f06f:
      abort();
    }
    if (*(int *)&plVar1[4].prev != 0) {
      batch_send((MppDevBatServ *)p,(MppDevBatTask *)&plVar1[-1].prev);
    }
    if (((byte)mpp_server_debug & 1) != 0) {
      fmt = "finish for no pending task\n";
LAB_0011f053:
      _mpp_log_l(4,"mpp_server",fmt,(char *)0x0);
      return;
    }
  }
  return;
code_r0x0011e82f:
  if (iVar4 == -5) {
    _mpp_log_l(2,"mpp_server","batch %d:%d task %d poll error found\n","process_task",
               (ulong)*(uint *)&plVar8[2].next,(ulong)*(uint *)&plVar13[2].prev,
               *(undefined4 *)((long)&plVar13[2].next + 4));
LAB_0011e90f:
    *(byte *)&plVar27->next = *(byte *)&plVar27->next | 1;
  }
  goto joined_r0x0011e7c7;
}

Assistant:

void process_task(void *p)
{
    MppDevBatServ *server = (MppDevBatServ *)p;
    Mutex *lock = server->lock;
    RK_S32 ret = MPP_OK;
    MppDevTask *task;
    MppDevBatTask *batch;
    MppDevSession *session = NULL;
    MppDevBatCmd *bat_cmd;
    MppReqV1 *req = NULL;
    RK_S32 pending = 0;

    mpp_serv_dbg_flow("process task start\n");

    /* 1. try poll and get finished task */
    do {
        batch = list_first_entry_or_null(&server->list_batch, MppDevBatTask, link_server);
        if (NULL == batch)
            break;

        mpp_assert(batch->wait_req_cnt);
        ret = mpp_service_ioctl_request(server->server_fd, batch->wait_reqs);
        if (!ret) {
            MppDevTask *n;

            list_for_each_entry_safe(task, n, &batch->link_tasks, MppDevTask, link_batch) {
                RK_S32 batch_slot_id = task->batch_slot_id;
                MppDevBatCmd *cmd = batch->bat_cmd + batch_slot_id;

                mpp_assert(batch_slot_id < server->max_task_in_batch);
                session = task->session;

                ret = cmd->ret;
                if (ret == EAGAIN)
                    continue;

                if (ret == -EIO) {
                    mpp_err_f("batch %d:%d task %d poll error found\n",
                              batch->batch_id, task->batch_slot_id, task->task_id);
                    cmd->flag |= 1;
                    continue;
                }
                if (ret == 0) {
                    list_del_init(&task->link_batch);
                    task->batch = NULL;

                    mpp_serv_dbg_flow("batch %d:%d session %d ready and remove\n",
                                      batch->batch_id, task->batch_slot_id, session->client);
                    session->cond->lock();
                    session->task_done++;
                    session->cond->signal();
                    session->cond->unlock();
                    if (session->ctx && session->ctx->dev_cb)
                        mpp_callback(session->ctx->dev_cb, NULL);

                    batch->poll_cnt++;
                    cmd->flag |= 1;
                }
            }

            mpp_serv_dbg_flow("batch %d fill %d poll %d\n", batch->batch_id,
                              batch->fill_cnt, batch->poll_cnt);

            if (batch->poll_cnt == batch->fill_cnt) {
                mpp_serv_dbg_flow("batch %d poll done\n", batch->batch_id);
                list_del_init(&batch->link_server);
                list_add_tail(&batch->link_server, &server->list_batch_free);
                server->batch_run--;
                server->batch_free++;

                batch_reset(batch);
                batch = NULL;
                continue;
            }
        } else {
            mpp_log_f("batch %d poll ret %d errno %d %s", batch->batch_id,
                      ret, errno, strerror(errno));
            mpp_log_f("stop timer\n");
            mpp_timer_set_enable(server->timer, 0);
        }
        break;
    } while (1);

    /* 2. get prending task to fill */
    lock->lock();
    pending = server->pending_count;
    if (!pending && !server->batch_run && !server->session_count) {
        mpp_timer_set_enable(server->timer, 0);
        mpp_serv_dbg_flow("stop timer\n");
    }
    lock->unlock();

    mpp_serv_dbg_flow("pending %d running %d free %d max %d process start\n",
                      pending, server->batch_run, server->batch_free, server->batch_max_count);

try_proc_pending_task:
    /* 3. try get batch task*/
    if (!server->batch_free) {
        /* if not enough and max count does not reached create new batch */
        if (server->batch_free + server->batch_run >= server->batch_max_count) {
            mpp_serv_dbg_flow("finish for not batch slot\n");
            return ;
        }

        batch_add(server);
    }
    mpp_assert(server->batch_free);

    /* 4. if no pending task to send check timeout batch and send it */
    if (!pending) {
        if (!server->batch_free) {
            /* no pending and no free batch just done */
            return;
        }

        batch = list_first_entry_or_null(&server->list_batch_free, MppDevBatTask, link_server);
        mpp_assert(batch);
        if (NULL == batch) {
            mpp_log_f("batch run %d free %d\n", server->batch_run, server->batch_free);
            return;
        }

        /* send one timeout task */
        if (batch->fill_cnt)
            batch_send(server, batch);

        mpp_serv_dbg_flow("finish for no pending task\n");
        return;
    }

    mpp_serv_dbg_flow("pending task %d left to process\n", pending);

    /* 5. add task to add batch and try send batch */
    if (!server->batch_free) {
        /* no pending and no free batch just done */
        return;
    }

    batch = list_first_entry_or_null(&server->list_batch_free, MppDevBatTask, link_server);
    mpp_assert(batch);
    mpp_assert(pending);

    task = NULL;
    lock->lock();
    task = list_first_entry_or_null(&server->pending_task, MppDevTask, link_server);
    list_del_init(&task->link_server);
    server->pending_count--;
    lock->unlock();
    pending--;

    /* first task and setup new batch id */
    if (!batch->fill_cnt)
        batch->batch_id = server->batch_id++;

    task->batch = batch;
    task->batch_slot_id = batch->fill_cnt++;
    mpp_assert(task->batch_slot_id < server->max_task_in_batch);
    list_add_tail(&task->link_batch, &batch->link_tasks);
    if (batch->fill_cnt >= server->max_task_in_batch)
        batch->fill_full = 1;

    session = task->session;
    mpp_assert(session);
    mpp_assert(session->ctx);

    bat_cmd = batch->bat_cmd + task->batch_slot_id;
    bat_cmd->flag = 0;
    bat_cmd->client = session->client;
    bat_cmd->ret = 0;

    /* fill task to batch */
    /* add session info before each session task and then copy session request */
    req = &batch->send_reqs[batch->send_req_cnt++];
    req->cmd = MPP_CMD_SET_SESSION_FD;
    req->flag = MPP_FLAGS_MULTI_MSG;
    req->offset = 0;
    req->size = sizeof(*bat_cmd);
    req->data_ptr = REQ_DATA_PTR(bat_cmd);

    {
        RK_S32 i;

        for (i = 0; i < task->req_cnt; i++)
            batch->send_reqs[batch->send_req_cnt++] = task->req[i];
    }

    mpp_assert(batch->send_req_cnt <= server->max_task_in_batch * MAX_REQ_NUM);

    /* setup poll request */
    req = &batch->wait_reqs[batch->wait_req_cnt++];
    req->cmd = MPP_CMD_SET_SESSION_FD;
    req->flag = MPP_FLAGS_MULTI_MSG;
    req->offset = 0;
    req->size = sizeof(*bat_cmd);
    req->data_ptr = REQ_DATA_PTR(bat_cmd);

    req = &batch->wait_reqs[batch->wait_req_cnt++];
    req->cmd = MPP_CMD_POLL_HW_FINISH;
    req->flag = MPP_FLAGS_POLL_NON_BLOCK | MPP_FLAGS_MULTI_MSG | MPP_FLAGS_LAST_MSG;
    req->offset = 0;
    req->size = 0;
    req->data_ptr = 0;

    mpp_serv_dbg_flow("batch %d:%d add task %d:%d:%d\n",
                      batch->batch_id, task->batch_slot_id, session->client,
                      task->slot_idx, task->task_id);

    if (batch->fill_full) {
        list_del_init(&batch->link_server);
        list_add_tail(&batch->link_server, &server->list_batch);
        mpp_serv_dbg_flow("batch %d -> fill_nb %d fill ready\n",
                          batch->batch_id, batch->fill_cnt);
        batch_send(server, batch);
        batch = NULL;
    }
    goto try_proc_pending_task;
}